

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3648a::numeric<double>::validate
          (numeric<double> *this,json_pointer *ptr,json *instance,json_patch *param_3,
          error_handler *e)

{
  double *pdVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  double __x;
  double dVar5;
  double dVar6;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d8 [2];
  json *local_1b8;
  ostringstream oss;
  
  __x = nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::get_impl<double,_0>(instance);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  if (((__x != 0.0) || (NAN(__x))) && ((this->multipleOf_).first != false)) {
    dVar5 = remainder(__x,(this->multipleOf_).second);
    dVar6 = ABS(__x / (this->multipleOf_).second);
    uVar4 = -(ulong)(1.0 < dVar6);
    local_1b8 = (json *)(~uVar4 & (ulong)dVar5 | (ulong)(dVar5 / dVar6) & uVar4);
    dVar5 = nextafter(__x,0.0);
    if (ABS(dVar5 - __x) < ABS((double)local_1b8)) {
      poVar2 = std::operator<<((ostream *)&oss,"instance is not a multiple of ");
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_double_&,_double,_0>(local_1d8,&(this->multipleOf_).second);
      nlohmann::json_abi_v3_11_2::operator<<(poVar2,local_1d8);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(local_1d8);
    }
  }
  if ((this->maximum_).first == true) {
    pdVar1 = &(this->maximum_).second;
    dVar5 = (this->maximum_).second;
    if ((this->exclusiveMaximum_ != true) || (__x < dVar5)) {
      if (__x <= dVar5) goto LAB_001199b4;
      poVar2 = std::operator<<((ostream *)&oss,"instance exceeds maximum of ");
      local_1b8 = instance;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_double_&,_double,_0>(local_1d8,pdVar1);
      nlohmann::json_abi_v3_11_2::operator<<(poVar2,local_1d8);
    }
    else {
      poVar2 = std::operator<<((ostream *)&oss,"instance exceeds or equals maximum of ");
      local_1b8 = instance;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_double_&,_double,_0>(local_1d8,pdVar1);
      nlohmann::json_abi_v3_11_2::operator<<(poVar2,local_1d8);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(local_1d8);
    instance = local_1b8;
  }
LAB_001199b4:
  if ((this->minimum_).first == true) {
    pdVar1 = &(this->minimum_).second;
    dVar5 = (this->minimum_).second;
    if ((this->exclusiveMinimum_ != true) || (dVar5 < __x)) {
      if (dVar5 <= __x) goto LAB_00119a69;
      poVar2 = std::operator<<((ostream *)&oss,"instance is below minimum of ");
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_double_&,_double,_0>(local_1d8,pdVar1);
      nlohmann::json_abi_v3_11_2::operator<<(poVar2,local_1d8);
    }
    else {
      poVar2 = std::operator<<((ostream *)&oss,"instance is below or equals minimum of ");
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_double_&,_double,_0>(local_1d8,pdVar1);
      nlohmann::json_abi_v3_11_2::operator<<(poVar2,local_1d8);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(local_1d8);
  }
LAB_00119a69:
  std::ostream::seekp((long)&oss,_S_beg);
  lVar3 = std::ostream::tellp();
  if (lVar3 != 0) {
    std::ostream::seekp((long)&oss,_S_beg);
    std::__cxx11::stringbuf::str();
    (*e->_vptr_error_handler[2])(e,ptr,instance,local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &, error_handler &e) const override
	{
		T value = instance; // conversion of json to value_type

		std::ostringstream oss;

		if (multipleOf_.first && value != 0) // zero is multiple of everything
			if (violates_multiple_of(value))
				oss << "instance is not a multiple of " << json(multipleOf_.second);

		if (maximum_.first) {
			if (exclusiveMaximum_ && value >= maximum_.second)
				oss << "instance exceeds or equals maximum of " << json(maximum_.second);
			else if (value > maximum_.second)
				oss << "instance exceeds maximum of " << json(maximum_.second);
		}

		if (minimum_.first) {
			if (exclusiveMinimum_ && value <= minimum_.second)
				oss << "instance is below or equals minimum of " << json(minimum_.second);
			else if (value < minimum_.second)
				oss << "instance is below minimum of " << json(minimum_.second);
		}

		oss.seekp(0, std::ios::end);
		auto size = oss.tellp();
		if (size != 0) {
			oss.seekp(0, std::ios::beg);
			e.error(ptr, instance, oss.str());
		}
	}